

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O0

ulong __thiscall CVmObjIterIdx::rebuild_image(CVmObjIterIdx *this,char *buf,ulong buflen)

{
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t copy_size;
  
  if (0x14 < in_RDX) {
    memcpy(in_RSI,*(void **)(in_RDI + 8),0x15);
  }
  return 0x15;
}

Assistant:

ulong CVmObjIterIdx::rebuild_image(VMG_ char *buf, ulong buflen)
{
    /* calculate our data size - just store our entire extension */
    size_t copy_size = VMOBJITERIDX_EXT_SIZE;

    /* make sure we have room for our data */
    if (copy_size > buflen)
        return copy_size;

    /* copy the data */
    memcpy(buf, ext_, copy_size);

    /* return the size */
    return copy_size;
}